

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O2

RealType __thiscall
OpenMD::InteractionManager::getSuggestedCutoffRadius(InteractionManager *this,AtomType *atype)

{
  int iVar1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  RealType RVar5;
  double dVar6;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar1 = AtomType::getIdent(atype);
  lVar4 = (long)iVar1;
  lVar2 = *(long *)&(this->interactions_).
                    super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar4].
                    super__Vector_base<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  p_Var3 = *(_Rb_tree_node_base **)(lVar2 + 0x18 + lVar4 * 0x30);
  RVar5 = 0.0;
  while (p_Var3 != (_Rb_tree_node_base *)(lVar2 + lVar4 * 0x30 + 8)) {
    dVar6 = (double)(**(code **)(**(long **)(p_Var3 + 1) + 0x28))
                              (*(long **)(p_Var3 + 1),atype,atype);
    if (dVar6 <= RVar5) {
      dVar6 = RVar5;
    }
    RVar5 = dVar6;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    lVar2 = *(long *)&(this->interactions_).
                      super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar4].
                      super__Vector_base<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
                      ._M_impl.super__Vector_impl_data;
  }
  return RVar5;
}

Assistant:

RealType InteractionManager::getSuggestedCutoffRadius(AtomType* atype) {
    if (!initialized_) initialize();

    int atid = atype->getIdent();

    set<NonBondedInteractionPtr>::iterator it;
    RealType cutoff = 0.0;

    for (it = interactions_[atid][atid].begin();
         it != interactions_[atid][atid].end(); ++it) {
      cutoff =
          max(cutoff, (*it)->getSuggestedCutoffRadius(make_pair(atype, atype)));
    }
    return cutoff;
  }